

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::
     DumpCallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCode op,
               OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  AuxArray<unsigned_int> *pAVar1;
  uint i;
  ulong uVar2;
  
  DumpCallIFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
            (op,data,dumpFunction,reader);
  if (((data->super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).Options &
      CallIExtended_SpreadArgs) == CallIExtended_None) {
    return;
  }
  pAVar1 = ByteCodeReader::ReadAuxArray<unsigned_int>
                     ((data->super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>
                      ).SpreadAuxOffset,dumpFunction);
  Output::Print(L" spreadArgs [",(ulong)pAVar1->count);
  uVar2 = 0;
  do {
    if (pAVar1->count <= uVar2) {
LAB_0074dd9c:
      Output::Print(L"]");
      return;
    }
    if (uVar2 != 0) {
      if (uVar2 == 0xb) {
        Output::Print(L", ...");
        goto LAB_0074dd9c;
      }
      Output::Print(L", ");
    }
    Output::Print(L"%u",(ulong)pAVar1[uVar2 + 1].count);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void ByteCodeDumper::DumpCallIExtendedFlags(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpCallIFlags(op, data, dumpFunction, reader);
        if (data->Options & Js::CallIExtended_SpreadArgs)
        {
            const Js::AuxArray<uint32> *arr = reader.ReadAuxArray<uint32>(data->SpreadAuxOffset, dumpFunction);
            Output::Print(_u(" spreadArgs ["), arr->count);
            for (uint i = 0; i < arr->count; i++)
            {
                if (i > 10)
                {
                    Output::Print(_u(", ..."));
                    break;
                }
                if (i != 0)
                {
                    Output::Print(_u(", "));
                }
                Output::Print(_u("%u"), arr->elements[i]);
            }
            Output::Print(_u("]"));
        }
    }